

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OISEffect.h
# Opt level: O2

void __thiscall OIS::PeriodicEffect::~PeriodicEffect(PeriodicEffect *this)

{
  return;
}

Assistant:

class _OISExport PeriodicEffect : public ForceEffect
	{
	public:
		PeriodicEffect() :
		 magnitude(0), offset(0), phase(0), period(0) { }

		Envelope envelope; //Optional Envelope

		unsigned short magnitude; //0 to 10,0000
		signed short offset;
		unsigned short phase; //Position at which playback begins 0 to 35,999
		unsigned int period;  //Period of effect (microseconds)
	}